

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void pair_suite::test_string_bool(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  oarchive ar;
  ostringstream result;
  long *local_230 [2];
  long local_220 [2];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_210;
  basic_oarchive<char> local_1e8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            (&local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  paVar1 = &local_210.first.field_2;
  local_210.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"alpha","");
  local_210.second = true;
  trial::protocol::serialization::
  save_overloader<trial::protocol::json::basic_oarchive<char>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_void>
  ::save(&local_1e8,&local_210,0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[15]>
            ("result.str()","\"[\\\"alpha\\\",true]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x145,"void pair_suite::test_string_bool()",local_230,"[\"alpha\",true]");
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.first._M_dataplus._M_p,
                    local_210.first.field_2._M_allocated_capacity + 1);
  }
  local_1e8.super_common_oarchive<trial::protocol::json::basic_oarchive<char>_>._0_8_ =
       &PTR_vsave_001248d0;
  if (local_1e8.writer.stack.c.
      super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.writer.stack.c.
                    super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.writer.stack.c.
                          super__Vector_base<trial::protocol::json::basic_writer<char,_16UL>::frame,_std::allocator<trial::protocol::json::basic_writer<char,_16UL>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (**(code **)local_1e8.writer.encoder.storage._0_8_)();
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_string_bool()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::pair<std::string, bool> value("alpha", true);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[\"alpha\",true]");
}